

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::printAR(KktCheck *this)

{
  pointer pdVar1;
  pointer piVar2;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  undefined4 uStack_38;
  char buff [4];
  
  _uStack_38 = in_RAX;
  poVar4 = std::operator<<((ostream *)&std::cout,"N=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->numCol);
  poVar4 = std::operator<<(poVar4,",  M=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->numRow);
  poVar4 = std::operator<<(poVar4,",  NZ= ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numRow]);
  std::operator<<(poVar4,'\n');
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  uVar8 = 0;
  while( true ) {
    pdVar1 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8) break;
    sprintf(buff,"%2.1g ",pdVar1[uVar8]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,buff);
    uVar8 = uVar8 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"------AR | b----KktCheck-\n");
  iVar3 = 0;
  do {
    this->i = iVar3;
    if (this->numRow <= iVar3) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
        if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] <= -1e+200) {
          _uStack_38 = CONCAT44(0x666e692d,uStack_38);
        }
        else {
          sprintf(buff,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,buff);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
        if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]) {
          _uStack_38 = CONCAT44(0x666e69,uStack_38);
        }
        else {
          sprintf(buff,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,buff);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    iVar3 = 0;
    while (this->j = iVar3, iVar3 < this->numCol) {
      lVar6 = (long)this->i;
      piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar5 = (long)piVar2[lVar6];
          (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] != iVar3; lVar5 = lVar5 + 1) {
        if (piVar2[lVar6 + 1] <= lVar5) {
          pcVar7 = "   ";
          goto LAB_0014d3cd;
        }
      }
      pcVar7 = "   ";
      if ((int)lVar5 < piVar2[lVar6 + 1]) {
        sprintf(buff,"%2.1g ",
                (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5]);
        pcVar7 = buff;
      }
LAB_0014d3cd:
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,pcVar7);
      iVar3 = this->j + 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"  |   ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
    poVar4 = std::ostream::_M_insert<double>
                       ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[this->i]);
    std::operator<<(poVar4," < < ");
    poVar4 = std::ostream::_M_insert<double>
                       ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[this->i]);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = this->i + 1;
  } while( true );
}

Assistant:

void KktCheck::printAR() {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<ARstart[numRow]<<'\n';	

	char buff [4];
	cout<<"\n-----cost-----\n";
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR | b----KktCheck-\n";
	for (i=0;i<numRow;i++) {
		for (j=0;j<numCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
		
		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<endl;
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) { 
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) { 
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
}